

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O0

bool btGeometryUtil::areVerticesBehindPlane
               (btVector3 *planeNormal,btAlignedObjectArray<btVector3> *vertices,btScalar margin)

{
  int iVar1;
  btVector3 *v;
  btScalar *pbVar2;
  btAlignedObjectArray<btVector3> *in_RSI;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btScalar bVar3;
  btScalar dist;
  btVector3 *N1;
  int i;
  int numvertices;
  int local_24;
  
  iVar1 = btAlignedObjectArray<btVector3>::size(in_RSI);
  local_24 = 0;
  while( true ) {
    if (iVar1 <= local_24) {
      return true;
    }
    v = btAlignedObjectArray<btVector3>::operator[](in_RSI,local_24);
    bVar3 = btVector3::dot(in_RDI,v);
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
    if (0.0 < (bVar3 + pbVar2[3]) - in_XMM0_Da) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool	btGeometryUtil::areVerticesBehindPlane(const btVector3& planeNormal, const btAlignedObjectArray<btVector3>& vertices, btScalar	margin)
{
	int numvertices = vertices.size();
	for (int i=0;i<numvertices;i++)
	{
		const btVector3& N1 = vertices[i];
		btScalar dist = btScalar(planeNormal.dot(N1))+btScalar(planeNormal[3])-margin;
		if (dist>btScalar(0.))
		{
			return false;
		}
	}
	return true;
}